

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

void __thiscall cmCTestP4::DiffParser::~DiffParser(DiffParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_00bda5f8;
  pcVar2 = (this->RegexDiff).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar3 = (this->CurrentPath)._M_dataplus._M_p;
  paVar1 = &(this->CurrentPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bdd8c8;
  pcVar3 = (this->super_LineParser).Line._M_dataplus._M_p;
  paVar1 = &(this->super_LineParser).Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x2a0);
  return;
}

Assistant:

DiffParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexDiff.compile("^==== (.*)#[0-9]+ - (.*)");
  }